

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_9::toLower
                  (int32_t caseLocale,uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,
                  UCaseContext *csc,int32_t srcStart,int32_t srcLimit,Edits *edits,
                  UErrorCode *errorCode)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  uint uVar4;
  int destIndex;
  int result;
  int32_t iVar5;
  UTrie2 *pUVar6;
  undefined1 *puVar7;
  uint uVar8;
  uint c;
  short sVar9;
  UChar *s;
  UCaseContext *local_38;
  
  puVar7 = LatinCase::TO_LOWER_NORMAL;
  if (caseLocale != 1) {
    if (caseLocale < 0) {
      if ((options & 7) == 0) goto LAB_002e6bba;
    }
    else if ((caseLocale & 0x7ffffffeU) != 2) goto LAB_002e6bba;
    puVar7 = LatinCase::TO_LOWER_TR_LT;
  }
LAB_002e6bba:
  local_38 = csc;
  pUVar6 = ucase_getTrie_63();
  destIndex = 0;
  uVar4 = srcStart;
  do {
    do {
      while( true ) {
        uVar8 = srcStart;
        if (srcLimit <= (int)uVar8) {
          iVar5 = appendUnchanged(dest,destIndex,destCapacity,src + (int)uVar4,uVar8 - uVar4,options
                                  ,edits);
          if (-1 < iVar5) {
            return iVar5;
          }
          goto LAB_002e6e51;
        }
        UVar2 = src[(int)uVar8];
        c = (uint)(ushort)UVar2;
        if (0x17e < (ushort)UVar2) break;
        cVar1 = puVar7[(ushort)UVar2];
        sVar9 = (short)cVar1;
        if (cVar1 == -0x80) {
LAB_002e6cc6:
          srcStart = uVar8 + 1;
          if (((((ushort)UVar2 & 0xfc00) == 0xd800) && (srcStart < srcLimit)) &&
             (((ushort)src[srcStart] & 0xfc00) == 0xdc00)) {
            c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)src[srcStart] + 0xfca02400;
            srcStart = uVar8 + 2;
          }
          if (caseLocale < 0) {
            result = ucase_toFullFolding_63(c,&s,options);
          }
          else {
            local_38->cpStart = uVar8;
            local_38->cpLimit = srcStart;
            result = ucase_toFullLower_63(c,utf16_caseContextIterator,local_38,&s,caseLocale);
          }
          if ((-1 < result) &&
             ((iVar5 = appendUnchanged(dest,destIndex,destCapacity,src + (int)uVar4,uVar8 - uVar4,
                                       options,edits), iVar5 < 0 ||
              (destIndex = appendResult(dest,iVar5,destCapacity,result,s,srcStart - uVar8,options,
                                        edits), uVar4 = srcStart, destIndex < 0))))
          goto LAB_002e6e51;
        }
        else {
          srcStart = uVar8 + 1;
          if (cVar1 != '\0') goto LAB_002e6c65;
        }
      }
      if ((0xd7ff < (ushort)UVar2) ||
         (uVar3 = pUVar6->index
                  [((ushort)UVar2 & 0x1f) + (uint)pUVar6->index[(ushort)UVar2 >> 5] * 4],
         (uVar3 & 8) != 0)) goto LAB_002e6cc6;
      srcStart = uVar8 + 1;
    } while (uVar3 < 0x80 || (uVar3 & 2) == 0);
    sVar9 = (short)((uint)(int)(short)uVar3 >> 7);
LAB_002e6c65:
    srcStart = uVar8 + 1;
    uVar4 = appendUnchanged(dest,destIndex,destCapacity,src + (int)uVar4,~uVar4 + srcStart,options,
                            edits);
    if ((int)uVar4 < 0) break;
    if ((int)uVar4 < destCapacity) {
      dest[uVar4] = sVar9 + UVar2;
LAB_002e6d1b:
      destIndex = uVar4 + 1;
    }
    else {
      destIndex = -1;
      if (uVar4 != 0x7fffffff) goto LAB_002e6d1b;
    }
    if (edits != (Edits *)0x0) {
      Edits::addReplace(edits,1,1);
    }
    uVar4 = srcStart;
  } while (-1 < destIndex);
LAB_002e6e51:
  *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return 0;
}

Assistant:

int32_t toLower(int32_t caseLocale, uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, UCaseContext *csc, int32_t srcStart, int32_t srcLimit,
                icu::Edits *edits, UErrorCode &errorCode) {
    const int8_t *latinToLower;
    if (caseLocale == UCASE_LOC_ROOT ||
            (caseLocale >= 0 ?
                !(caseLocale == UCASE_LOC_TURKISH || caseLocale == UCASE_LOC_LITHUANIAN) :
                (options & _FOLD_CASE_OPTIONS_MASK) == U_FOLD_CASE_DEFAULT)) {
        latinToLower = LatinCase::TO_LOWER_NORMAL;
    } else {
        latinToLower = LatinCase::TO_LOWER_TR_LT;
    }
    const UTrie2 *trie = ucase_getTrie();
    int32_t destIndex = 0;
    int32_t prev = srcStart;
    int32_t srcIndex = srcStart;
    for (;;) {
        // fast path for simple cases
        UChar lead = 0;
        while (srcIndex < srcLimit) {
            lead = src[srcIndex];
            int32_t delta;
            if (lead < LatinCase::LONG_S) {
                int8_t d = latinToLower[lead];
                if (d == LatinCase::EXC) { break; }
                ++srcIndex;
                if (d == 0) { continue; }
                delta = d;
            } else if (lead >= 0xd800) {
                break;  // surrogate or higher
            } else {
                uint16_t props = UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, lead);
                if (UCASE_HAS_EXCEPTION(props)) { break; }
                ++srcIndex;
                if (!UCASE_IS_UPPER_OR_TITLE(props) || (delta = UCASE_GET_DELTA(props)) == 0) {
                    continue;
                }
            }
            lead += static_cast<UChar>(delta);
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, srcIndex - 1 - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendUChar(dest, destIndex, destCapacity, lead);
                if (edits != nullptr) {
                    edits->addReplace(1, 1);
                }
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
        if (srcIndex >= srcLimit) {
            break;
        }
        // slow path
        int32_t cpStart = srcIndex++;
        UChar trail;
        UChar32 c;
        if (U16_IS_LEAD(lead) && srcIndex < srcLimit && U16_IS_TRAIL(trail = src[srcIndex])) {
            c = U16_GET_SUPPLEMENTARY(lead, trail);
            ++srcIndex;
        } else {
            c = lead;
        }
        const UChar *s;
        if (caseLocale >= 0) {
            csc->cpStart = cpStart;
            csc->cpLimit = srcIndex;
            c = ucase_toFullLower(c, utf16_caseContextIterator, csc, &s, caseLocale);
        } else {
            c = ucase_toFullFolding(c, &s, options);
        }
        if (c >= 0) {
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, cpStart - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                         srcIndex - cpStart, options, edits);
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
    }
    destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                src + prev, srcIndex - prev, options, edits);
    if (destIndex < 0) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    return destIndex;
}